

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwtDec.c
# Opt level: O2

void Rwt_ManPreprocess(Rwt_Man_t *p)

{
  byte bVar1;
  Dec_Edge_t DVar2;
  unsigned_short *puVar3;
  Vec_Vec_t *pVVar4;
  void **ppvVar5;
  Vec_Ptr_t *pVVar6;
  Vec_Ptr_t *pVVar7;
  Rwt_Node_t *pGraph;
  char *__function;
  int nCapMin;
  undefined8 uVar8;
  Vec_Ptr_t *pVVar9;
  char *__assertion;
  long lVar10;
  long lVar11;
  Rwt_Node_t *pRVar12;
  uint uVar13;
  int iVar14;
  
  puVar3 = (unsigned_short *)calloc(1,0x1bc);
  p->pMapInv = puVar3;
  pVVar4 = (Vec_Vec_t *)malloc(0x10);
  pVVar4->nCap = 0xde;
  uVar8 = 0x6f0;
  ppvVar5 = (void **)malloc(0x6f0);
  pVVar4->pArray = ppvVar5;
  for (lVar10 = 0; lVar10 != 0xde; lVar10 = lVar10 + 1) {
    pVVar6 = Vec_PtrAlloc((int)uVar8);
    ppvVar5[lVar10] = pVVar6;
  }
  pVVar4->nSize = 0xde;
  p->vClasses = pVVar4;
  lVar10 = 0;
  do {
    if (p->nFuncs <= lVar10) {
      iVar14 = 0;
      do {
        pVVar4 = p->vClasses;
        if (pVVar4->nSize <= iVar14) {
          return;
        }
        for (lVar10 = 0; pVVar6 = Vec_VecEntry(pVVar4,iVar14), lVar10 < pVVar6->nSize;
            lVar10 = lVar10 + 1) {
          pVVar4 = p->vClasses;
          pVVar6 = Vec_VecEntry(pVVar4,iVar14);
          if (pVVar6->nSize <= lVar10) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pRVar12 = (Rwt_Node_t *)pVVar6->pArray[lVar10];
          if (((ulong)pRVar12 & 1) != 0) {
            __assertion = "!Rwt_IsComplement(pNode)";
            __function = "Dec_Graph_t *Rwt_NodePreprocess(Rwt_Man_t *, Rwt_Node_t *)";
            uVar13 = 0x5f;
            goto LAB_0070c40f;
          }
          if (*(short *)&pRVar12->field_0x8 == 0xff) {
            pGraph = (Rwt_Node_t *)Dec_GraphCreate((int)pVVar4);
            DVar2 = (Dec_Edge_t)(*(uint *)&pGraph->p1 & 0x80000000 | 7);
LAB_0070c37d:
            *(Dec_Edge_t *)&pGraph->p1 = DVar2;
          }
          else {
            if (*(short *)&pRVar12->field_0x8 != 0) {
              pGraph = (Rwt_Node_t *)Dec_GraphCreate((int)pVVar4);
              Rwt_ManIncTravId(p);
              DVar2 = Rwt_TravCollect_rec(p,pRVar12,(Dec_Graph_t *)pGraph);
              goto LAB_0070c37d;
            }
            pGraph = (Rwt_Node_t *)calloc(1,0x20);
            pGraph->Id = 1;
            *(undefined4 *)&pGraph->p1 = 1;
          }
          pRVar12->pNext = pGraph;
          pVVar4 = p->vClasses;
        }
        iVar14 = iVar14 + 1;
      } while( true );
    }
    pRVar12 = p->pTable[lVar10];
    if (pRVar12 != (Rwt_Node_t *)0x0) {
      for (; pRVar12 != (Rwt_Node_t *)0x0; pRVar12 = pRVar12->pNext) {
        if (*(ushort *)&pRVar12->field_0x8 != *(ushort *)&p->pTable[lVar10]->field_0x8) {
          __assertion = "pNode->uTruth == p->pTable[i]->uTruth";
          __function = "void Rwt_ManPreprocess(Rwt_Man_t *)";
          uVar13 = 0x41;
LAB_0070c40f:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/rwt/rwtDec.c"
                        ,uVar13,__function);
        }
        bVar1 = p->pMap[*(ushort *)&pRVar12->field_0x8];
        if (0xdd < bVar1) {
          __assertion = "p->pMap[pNode->uTruth] < 222";
          __function = "void Rwt_ManPreprocess(Rwt_Man_t *)";
          uVar13 = 0x42;
          goto LAB_0070c40f;
        }
        pVVar6 = (Vec_Ptr_t *)p->vClasses;
        uVar13 = (uint)bVar1;
        if (pVVar6->nSize <= (int)uVar13) {
          pVVar9 = pVVar6;
          Vec_PtrGrow(pVVar6,bVar1 + 1);
          for (lVar11 = (long)pVVar6->nSize; lVar11 <= (long)(ulong)uVar13; lVar11 = lVar11 + 1) {
            pVVar7 = Vec_PtrAlloc((int)pVVar9);
            pVVar6->pArray[lVar11] = pVVar7;
          }
          pVVar6->nSize = bVar1 + 1;
        }
        pVVar6 = Vec_VecEntry((Vec_Vec_t *)pVVar6,uVar13);
        iVar14 = pVVar6->nSize;
        if (iVar14 == pVVar6->nCap) {
          nCapMin = iVar14 * 2;
          if (iVar14 < 0x10) {
            nCapMin = 0x10;
          }
          Vec_PtrGrow(pVVar6,nCapMin);
          iVar14 = pVVar6->nSize;
        }
        pVVar6->nSize = iVar14 + 1;
        pVVar6->pArray[iVar14] = pRVar12;
        p->pMapInv[p->pMap[*(ushort *)&pRVar12->field_0x8]] =
             p->puCanons[*(ushort *)&pRVar12->field_0x8];
      }
    }
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

void Rwt_ManPreprocess( Rwt_Man_t * p )
{
    Dec_Graph_t * pGraph;
    Rwt_Node_t * pNode;
    int i, k;
    // put the nodes into the structure
    p->pMapInv  = ABC_ALLOC( unsigned short, 222 );
    memset( p->pMapInv, 0, sizeof(unsigned short) * 222 );
    p->vClasses = Vec_VecStart( 222 );
    for ( i = 0; i < p->nFuncs; i++ )
    {
        if ( p->pTable[i] == NULL )
            continue;
        // consider all implementations of this function
        for ( pNode = p->pTable[i]; pNode; pNode = pNode->pNext )
        {
            assert( pNode->uTruth == p->pTable[i]->uTruth );
            assert( p->pMap[pNode->uTruth] < 222 ); // Always >= 0 b/c unsigned.
            Vec_VecPush( p->vClasses, p->pMap[pNode->uTruth], pNode );
            p->pMapInv[ p->pMap[pNode->uTruth] ] = p->puCanons[pNode->uTruth];
        }
    }
    // compute decomposition forms for each node and verify them
    Vec_VecForEachEntry( Rwt_Node_t *, p->vClasses, pNode, i, k )
    {
        pGraph = Rwt_NodePreprocess( p, pNode );
        pNode->pNext = (Rwt_Node_t *)pGraph;
//        assert( pNode->uTruth == (Dec_GraphDeriveTruth(pGraph) & 0xFFFF) );
    }
}